

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

void fs_event_cb_file_current_dir(uv_fs_event_t *handle,char *filename,int events,int status)

{
  uv_fs_event_t *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  uv_fs_event_t *unaff_RBX;
  uv_work_t uStackY_5d0;
  uv_loop_t *puStackY_550;
  uv_loop_t uStackY_548;
  uv_fs_event_t *puStackY_1f8;
  uv_buf_t uStack_1e0;
  uv_fs_t uStack_1d0;
  uv_fs_event_t *puStack_18;
  
  if (fs_event_cb_called == '\x01') {
    fs_event_cb_file_current_dir_cold_3();
    puVar1 = handle;
LAB_0014d264:
    filename = (char *)puVar1;
    fs_event_cb_file_current_dir_cold_1();
  }
  else {
    fs_event_cb_called = '\x01';
    puVar1 = handle;
    if (status != 0) goto LAB_0014d264;
    iVar2 = strcmp(filename,"watch_file");
    unaff_RBX = handle;
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
      return;
    }
  }
  fs_event_cb_file_current_dir_cold_2();
  puStackY_1f8 = (uv_fs_event_t *)0x14d27f;
  puStack_18 = unaff_RBX;
  uv_close((uv_handle_t *)filename,(uv_close_cb)0x0);
  puStackY_1f8 = (uv_fs_event_t *)0x14d29d;
  uVar3 = uv_fs_open((uv_loop_t *)0x0,&uStack_1d0,"watch_file",2,0,(uv_fs_cb)0x0);
  if ((int)uVar3 < 0) {
    puStackY_1f8 = (uv_fs_event_t *)0x14d335;
    timer_cb_touch_cold_1();
LAB_0014d335:
    puStackY_1f8 = (uv_fs_event_t *)0x14d33a;
    timer_cb_touch_cold_2();
  }
  else {
    unaff_RBX = (uv_fs_event_t *)(ulong)uVar3;
    puStackY_1f8 = (uv_fs_event_t *)0x14d2b4;
    uv_fs_req_cleanup(&uStack_1d0);
    puStackY_1f8 = (uv_fs_event_t *)0x14d2c5;
    uStack_1e0 = uv_buf_init("foo",4);
    puStackY_1f8 = (uv_fs_event_t *)0x14d2f2;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&uStack_1d0,uVar3,&uStack_1e0,1,-1,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0014d335;
    puStackY_1f8 = (uv_fs_event_t *)0x14d303;
    uv_fs_req_cleanup(&uStack_1d0);
    puStackY_1f8 = (uv_fs_event_t *)0x14d311;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_1d0,uVar3,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      puStackY_1f8 = (uv_fs_event_t *)0x14d31f;
      uv_fs_req_cleanup(&uStack_1d0);
      timer_cb_touch_called = timer_cb_touch_called + 1;
      return;
    }
  }
  puStackY_1f8 = (uv_fs_event_t *)run_test_fork_threadpool_queue_work_simple;
  timer_cb_touch_cold_3();
  puVar5 = &uStackY_548;
  puStackY_550 = (uv_loop_t *)0x14d34c;
  puStackY_1f8 = unaff_RBX;
  puVar4 = uv_default_loop();
  puStackY_550 = (uv_loop_t *)0x14d354;
  assert_run_work(puVar4);
  puStackY_550 = (uv_loop_t *)0x14d359;
  uVar3 = fork();
  if (uVar3 == 0) {
    puStackY_550 = (uv_loop_t *)0x14d383;
    getpid();
    puStackY_550 = (uv_loop_t *)0x14d393;
    printf("Running child in %d\n");
    puStackY_550 = (uv_loop_t *)0x14d39e;
    uv_loop_init(&uStackY_548);
    puStackY_550 = (uv_loop_t *)0x14d3aa;
    puts("Child first watch");
    puStackY_550 = (uv_loop_t *)0x14d3b2;
    assert_run_work(&uStackY_548);
    puStackY_550 = (uv_loop_t *)0x14d3ba;
    uv_loop_close(&uStackY_548);
    puStackY_550 = (uv_loop_t *)0x14d3c6;
    puts("Child second watch default loop");
    puStackY_550 = (uv_loop_t *)0x14d3cb;
    puVar4 = uv_default_loop();
    puStackY_550 = (uv_loop_t *)0x14d3d3;
    iVar2 = uv_loop_fork(puVar4);
    if (iVar2 == 0) {
      puStackY_550 = (uv_loop_t *)0x14d3dc;
      puVar4 = uv_default_loop();
      puStackY_550 = (uv_loop_t *)0x14d3e4;
      assert_run_work(puVar4);
      puStackY_550 = (uv_loop_t *)0x14d3f0;
      puts("Exiting child ");
      goto LAB_0014d3f0;
    }
  }
  else {
    puVar5 = (uv_loop_t *)(ulong)uVar3;
    if (uVar3 != 0xffffffff) {
      puStackY_550 = (uv_loop_t *)0x14d36d;
      puVar4 = uv_default_loop();
      puStackY_550 = (uv_loop_t *)0x14d375;
      assert_run_work(puVar4);
      puStackY_550 = (uv_loop_t *)0x14d37c;
      assert_wait_child(uVar3);
LAB_0014d3f0:
      puStackY_550 = (uv_loop_t *)0x14d3f5;
      puVar5 = uv_default_loop();
      puStackY_550 = (uv_loop_t *)0x14d409;
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      puStackY_550 = (uv_loop_t *)0x14d413;
      uv_run(puVar5,UV_RUN_DEFAULT);
      puStackY_550 = (uv_loop_t *)0x14d418;
      puVar4 = uv_default_loop();
      puStackY_550 = (uv_loop_t *)0x14d420;
      iVar2 = uv_loop_close(puVar4);
      if (iVar2 == 0) {
        return;
      }
      puStackY_550 = (uv_loop_t *)0x14d434;
      run_test_fork_threadpool_queue_work_simple_cold_3();
    }
    puStackY_550 = (uv_loop_t *)0x14d439;
    run_test_fork_threadpool_queue_work_simple_cold_2();
  }
  puStackY_550 = (uv_loop_t *)assert_run_work;
  run_test_fork_threadpool_queue_work_simple_cold_1();
  puStackY_550 = puVar5;
  if (work_cb_count == 0) {
    if (after_work_cb_count != 0) goto LAB_0014d4e2;
    uVar3 = getpid();
    printf("Queue in %d\n",(ulong)uVar3);
    puVar5 = puVar4;
    iVar2 = uv_queue_work(puVar4,&uStackY_5d0,work_cb,after_work_cb);
    if (iVar2 != 0) goto LAB_0014d4e7;
    getpid();
    printf("Running in %d\n");
    uv_run(puVar4,UV_RUN_DEFAULT);
    if (work_cb_count == 1) {
      if (after_work_cb_count == 1) {
        work_cb_count = 0;
        after_work_cb_count = 0;
        return;
      }
      goto LAB_0014d4f1;
    }
  }
  else {
    assert_run_work_cold_1();
LAB_0014d4e2:
    assert_run_work_cold_2();
    puVar5 = puVar4;
LAB_0014d4e7:
    puVar4 = puVar5;
    assert_run_work_cold_3();
  }
  assert_run_work_cold_4();
LAB_0014d4f1:
  assert_run_work_cold_5();
  timer_cb_called = timer_cb_called + 1;
  uv_close((uv_handle_t *)puVar4,(uv_close_cb)0x0);
  return;
}

Assistant:

static void fs_event_cb_file_current_dir(uv_fs_event_t* handle,
                                         const char* filename,
                                         int events,
                                         int status) {
  ASSERT(fs_event_cb_called == 0);
  ++fs_event_cb_called;
  ASSERT(status == 0);
#if defined(__APPLE__) || defined(__linux__)
  ASSERT(strcmp(filename, "watch_file") == 0);
#else
  ASSERT(filename == NULL || strcmp(filename, "watch_file") == 0);
#endif
  uv_close((uv_handle_t*)handle, NULL);
}